

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcCompare.c
# Opt level: O3

int Mvc_CubeCompareInt(Mvc_Cube_t *pC1,Mvc_Cube_t *pC2,Mvc_Cube_t *pMask)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  
  uVar3 = *(uint *)&pC1->field_0x8 & 0xffffff;
  if (uVar3 != 0) {
    if (uVar3 != 1) {
      while( true ) {
        if (pC1->pData[uVar3] < pC2->pData[uVar3]) {
          return -1;
        }
        if (pC2->pData[uVar3] < pC1->pData[uVar3]) break;
        bVar2 = (int)uVar3 < 1;
        uVar3 = uVar3 - 1;
        if (bVar2) {
          return 0;
        }
      }
      return 1;
    }
    uVar3 = *(uint *)&pC2->field_0x14;
    uVar1 = *(uint *)&pC1->field_0x14;
    if (uVar1 < uVar3) {
      return -1;
    }
    if (uVar1 >= uVar3 && uVar1 != uVar3) {
      return 1;
    }
  }
  if (pC1->pData[0] < pC2->pData[0]) {
    return -1;
  }
  return (int)(pC2->pData[0] < pC1->pData[0]);
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Compares two cubes according to their integer value.]

  Description []

  SideEffects []

  SeeAlso     []

***********************************************************************/
int Mvc_CubeCompareInt( Mvc_Cube_t * pC1, Mvc_Cube_t * pC2, Mvc_Cube_t * pMask )
{
    if ( Mvc_Cube1Words(pC1) )
    {
        if ( pC1->pData[0] < pC2->pData[0] )
            return -1;
        if ( pC1->pData[0] > pC2->pData[0] )
            return 1;
        return 0;
    }
    else if ( Mvc_Cube2Words(pC1) )
    {
        if ( pC1->pData[1] < pC2->pData[1] )
            return -1;
        if ( pC1->pData[1] > pC2->pData[1] )
            return 1;
        if ( pC1->pData[0] < pC2->pData[0] )
            return -1;
        if ( pC1->pData[0] > pC2->pData[0] )
            return 1;
        return 0;
    }
    else                            
    {
        int i = Mvc_CubeReadLast(pC1);
        for(; i >= 0; i--)
        {
            if ( pC1->pData[i] < pC2->pData[i] )
                return -1;
            if ( pC1->pData[i] > pC2->pData[i] )
                return 1;
        }
        return 0;
    }
}